

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

void SubtractionHelper<unsigned_long,long,5>::
     SubtractThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
               (unsigned_long *lhs,long *rhs,unsigned_long *result)

{
  ulong uVar1;
  ulong uVar2;
  uint64_t uVar3;
  ulong *in_RDX;
  ulong *in_RSI;
  ulong *in_RDI;
  unsigned_long tmp;
  
  if ((long)*in_RSI < 0) {
    uVar1 = *in_RDI;
    uVar2 = *in_RDI;
    uVar3 = AbsValueHelper<long,_1>::Abs(0x1eeba2);
    *in_RDX = uVar2 + uVar3;
    if (*in_RDX < uVar1) goto LAB_001eebc4;
  }
  else {
    if (*in_RDI < *in_RSI) {
LAB_001eebc4:
      safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnOverflow();
    }
    *in_RDX = *in_RDI - *in_RSI;
  }
  return;
}

Assistant:

SAFEINT_CONSTEXPR14 static void SubtractThrow( const T& lhs, const U& rhs, T& result ) SAFEINT_CPP_THROW
    {
        // lhs is an std::uint64_t, rhs signed
        // must first see if rhs is positive or negative
        if( rhs >= 0 )
        {
            if( (std::uint64_t)rhs <= lhs )
            {
                result = (T)( lhs - (std::uint64_t)rhs );
                return;
            }
        }
        else
        {
            T tmp = lhs;
            // we're now effectively adding
            result = lhs + AbsValueHelper< U, GetAbsMethod< U >::method >::Abs( rhs );

            if(result >= tmp)
                return;
        }

        E::SafeIntOnOverflow();
    }